

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_odither_tables(j_decompress_ptr cinfo)

{
  long lVar1;
  long in_RDI;
  int nci;
  j_decompress_ptr unaff_retaddr;
  int j;
  int i;
  ODITHER_MATRIX_PTR odither;
  my_cquantize_ptr cquantize;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_RDI + 0x270);
  local_1c = 0;
  do {
    if (*(int *)(in_RDI + 0x90) <= local_1c) {
      return;
    }
    local_18 = (ODITHER_MATRIX_PTR)0x0;
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      if (*(int *)(lVar1 + 0x3c + (long)local_1c * 4) == *(int *)(lVar1 + 0x3c + (long)local_20 * 4)
         ) {
        local_18 = *(ODITHER_MATRIX_PTR *)(lVar1 + 0x50 + (long)local_20 * 8);
        break;
      }
    }
    if (local_18 == (ODITHER_MATRIX_PTR)0x0) {
      local_18 = make_odither_array(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    }
    *(ODITHER_MATRIX_PTR *)(lVar1 + 0x50 + (long)local_1c * 8) = local_18;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

LOCAL(void)
create_odither_tables(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  ODITHER_MATRIX_PTR odither;
  int i, j, nci;

  for (i = 0; i < cinfo->out_color_components; i++) {
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    odither = NULL;             /* search for matching prior component */
    for (j = 0; j < i; j++) {
      if (nci == cquantize->Ncolors[j]) {
        odither = cquantize->odither[j];
        break;
      }
    }
    if (odither == NULL)        /* need a new table? */
      odither = make_odither_array(cinfo, nci);
    cquantize->odither[i] = odither;
  }
}